

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_8d5133::HandleAsciiCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  char *__nptr;
  int iVar1;
  ulong uVar2;
  long lVar3;
  pointer pbVar4;
  bool bVar5;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string output;
  string error;
  char *local_a8;
  size_t local_a0;
  char local_98;
  undefined7 uStack_97;
  pointer local_88;
  string local_80;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  long local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)local_88 - (long)pbVar4) < 0x41) {
    local_60._M_len = (size_t)&local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"No output variable specified","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((long *)local_60._M_len != &local_50) {
      operator_delete((void *)local_60._M_len,local_50 + 1);
    }
    bVar5 = false;
  }
  else {
    local_88 = local_88 + -1;
    local_a8 = &local_98;
    local_a0 = 0;
    local_98 = '\0';
    uVar2 = 1;
    lVar3 = 0x28;
    do {
      __nptr = *(char **)((long)pbVar4 + lVar3 + -8);
      iVar1 = atoi(__nptr);
      bVar5 = iVar1 - 1U < 0xff;
      if (!bVar5) {
        local_50 = *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar3);
        local_60._M_len = 0x14;
        local_60._M_str = "Character with code ";
        local_40 = 0x10;
        local_38 = " does not exist.";
        views._M_len = 3;
        views._M_array = &local_60;
        local_48 = __nptr;
        cmCatViews_abi_cxx11_(&local_80,views);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00241455;
      }
      std::__cxx11::string::push_back((char)&local_a8);
      uVar2 = uVar2 + 1;
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < ((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) - 1U);
    value._M_str = local_a8;
    value._M_len = local_a0;
    cmMakefile::AddDefinition(status->Makefile,local_88,value);
LAB_00241455:
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
    }
  }
  return bVar5;
}

Assistant:

bool HandleAsciiCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("No output variable specified");
    return false;
  }
  std::string::size_type cc;
  std::string const& outvar = args.back();
  std::string output;
  for (cc = 1; cc < args.size() - 1; cc++) {
    int ch = atoi(args[cc].c_str());
    if (ch > 0 && ch < 256) {
      output += static_cast<char>(ch);
    } else {
      std::string error =
        cmStrCat("Character with code ", args[cc], " does not exist.");
      status.SetError(error);
      return false;
    }
  }
  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}